

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::FillLocalGeneratorToTargetMap(cmGlobalGenerator *this)

{
  cmTarget *target;
  bool bVar1;
  _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
  *this_00;
  mapped_type *pmVar2;
  _Rb_tree_node_base *p_Var3;
  pointer ppcVar4;
  cmTarget *ttt;
  cmLocalGenerator *local_60;
  cmTarget *local_58;
  pointer local_50;
  cmLocalGenerator *local_48;
  _Hash_node_base *local_40;
  map<cmLocalGenerator_*,_std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>_>_>_>
  *local_38;
  
  local_38 = &this->LocalGeneratorToTargetMap;
  std::
  _Rb_tree<cmLocalGenerator_*,_std::pair<cmLocalGenerator_*const,_std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>_>,_std::_Select1st<std::pair<cmLocalGenerator_*const,_std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>_>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>_>_>_>
  ::clear(&local_38->_M_t);
  local_50 = (this->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar4 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_50 != ppcVar4) {
    do {
      local_48 = *local_50;
      local_40 = (local_48->Makefile->Targets)._M_h._M_before_begin._M_nxt;
      if (local_40 != (_Hash_node_base *)0x0) {
        do {
          target = (cmTarget *)(local_40 + 5);
          local_60 = local_48;
          do {
            bVar1 = IsExcluded(this,local_60,target);
            if (bVar1) break;
            this_00 = (_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                       *)std::
                         map<cmLocalGenerator_*,_std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>_>_>_>
                         ::operator[](local_38,&local_60);
            local_58 = target;
            std::
            _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
            ::_M_insert_unique<cmTarget_const*>(this_00,&local_58);
            local_58 = target;
            pmVar2 = std::
                     map<const_cmTarget_*,_cmTargetDependSet,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetDependSet>_>_>
                     ::operator[](&this->TargetDependencies,&local_58);
            for (p_Var3 = (pmVar2->
                          super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                          )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var3 !=
                &(pmVar2->
                 super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                 )._M_t._M_impl.super__Rb_tree_header;
                p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
              local_58 = *(cmTarget **)(p_Var3 + 1);
              std::
              _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
              ::_M_insert_unique<cmTarget_const*const&>(this_00,&local_58);
            }
            local_60 = local_60->Parent;
          } while (local_60 != (cmLocalGenerator *)0x0);
          local_40 = local_40->_M_nxt;
        } while (local_40 != (_Hash_node_base *)0x0);
        ppcVar4 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      local_50 = local_50 + 1;
    } while (local_50 != ppcVar4);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillLocalGeneratorToTargetMap()
{
  this->LocalGeneratorToTargetMap.clear();
  // Loop over all targets in all local generators.
  for(std::vector<cmLocalGenerator*>::const_iterator
        lgi = this->LocalGenerators.begin();
      lgi != this->LocalGenerators.end(); ++lgi)
    {
    cmLocalGenerator* lg = *lgi;
    cmMakefile* mf = lg->GetMakefile();
    cmTargets const& targets = mf->GetTargets();
    for(cmTargets::const_iterator t = targets.begin(); t != targets.end(); ++t)
      {
      cmTarget const& target = t->second;

      // Consider the directory containing the target and all its
      // parents until something excludes the target.
      for(cmLocalGenerator* clg = lg; clg && !this->IsExcluded(clg, target);
          clg = clg->GetParent())
        {
        // This local generator includes the target.
        std::set<cmTarget const*>& targetSet =
          this->LocalGeneratorToTargetMap[clg];
        targetSet.insert(&target);

        // Add dependencies of the included target.  An excluded
        // target may still be included if it is a dependency of a
        // non-excluded target.
        TargetDependSet const& tgtdeps = this->GetTargetDirectDepends(target);
        for(TargetDependSet::const_iterator ti = tgtdeps.begin();
            ti != tgtdeps.end(); ++ti)
          {
          cmTarget const* ttt = *ti;
          targetSet.insert(ttt);
          }
        }
      }
    }
}